

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl.h
# Opt level: O0

Node * __thiscall
YAML::Node::operator[]<std::__cxx11::string>
          (Node *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  node *this_00;
  Node *in_RDI;
  node *value;
  shared_ptr<YAML::detail::memory_holder> *in_stack_ffffffffffffff38;
  string *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  node *node;
  Node *in_stack_ffffffffffffff50;
  Node *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *pMemory;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  node *in_stack_ffffffffffffff90;
  Node local_60;
  node *local_20;
  
  EnsureNodeExists(in_RDI);
  pMemory = &local_60.m_pMemory.
             super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ;
  std::shared_ptr<YAML::detail::memory_holder>::shared_ptr
            ((shared_ptr<YAML::detail::memory_holder> *)in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff38);
  this_00 = detail::node::get<std::__cxx11::string>
                      (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                       (shared_memory_holder *)pMemory);
  std::shared_ptr<YAML::detail::memory_holder>::~shared_ptr
            ((shared_ptr<YAML::detail::memory_holder> *)0x9dd597);
  local_20 = this_00;
  if (this_00 == (node *)0x0) {
    this_01 = &local_60;
    key_to_string<std::__cxx11::string>(in_stack_ffffffffffffff48);
    Node(this_01,(Zombie)((ulong)in_stack_ffffffffffffff48 >> 0x20),in_stack_ffffffffffffff40);
    std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    node = (node *)&stack0xffffffffffffff90;
    std::shared_ptr<YAML::detail::memory_holder>::shared_ptr
              ((shared_ptr<YAML::detail::memory_holder> *)this_00,in_stack_ffffffffffffff38);
    Node(in_stack_ffffffffffffff50,node,(shared_memory_holder *)this_00);
    std::shared_ptr<YAML::detail::memory_holder>::~shared_ptr
              ((shared_ptr<YAML::detail::memory_holder> *)0x9dd673);
  }
  return in_RDI;
}

Assistant:

inline const Node Node::operator[](const Key& key) const {
  EnsureNodeExists();
  detail::node* value =
      static_cast<const detail::node&>(*m_pNode).get(key, m_pMemory);
  if (!value) {
    return Node(ZombieNode, key_to_string(key));
  }
  return Node(*value, m_pMemory);
}